

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O1

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uchar uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  iterator iVar5;
  pointer pvVar6;
  pointer puVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  DynamicPartialIndex *this_00;
  uint *nxt;
  uint *__args;
  uint local_34;
  
  uVar9 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_34 = s;
  if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar9)
  goto LAB_0010b9e0;
  this_00 = this;
  if ((puVar3[uVar9] != '\0') && (bVar8 = has_parent(this,s,reverse_graph,dist), !bVar8)) {
    uVar9 = this->back_;
    this->back_ = uVar9 + 1;
    puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar9)
    goto LAB_0010b9e0;
    puVar4[uVar9] = local_34;
    uVar9 = (ulong)local_34;
    puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar9)
    goto LAB_0010b9e0;
    puVar3[uVar9] = '?';
    this_00 = (DynamicPartialIndex *)this->updated_;
    iVar5._M_current = (uint *)this_00->graph_;
    if (iVar5._M_current == *(uint **)&this_00->k_) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,&local_34);
    }
    else {
      *iVar5._M_current = local_34;
      this_00->graph_ = (Graph *)(iVar5._M_current + 1);
    }
  }
  while( true ) {
    uVar9 = this->front_;
    if (this->back_ == uVar9) {
      return;
    }
    this->front_ = uVar9 + 1;
    puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar9)
    break;
    uVar9 = (ulong)puVar4[uVar9];
    pvVar6 = (graph->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
             -0x5555555555555555;
    if (uVar10 < uVar9 || uVar10 - uVar9 == 0) break;
    puVar4 = *(pointer *)
              ((long)&pvVar6[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    for (__args = pvVar6[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args != puVar4; __args = __args + 1) {
      uVar9 = (ulong)*__args;
      puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar9)
      goto LAB_0010b9e0;
      uVar1 = puVar3[uVar9];
      if (((uVar1 != '\0') && (uVar1 != '?')) &&
         (bVar8 = has_parent(this_00,*__args,reverse_graph,dist), !bVar8)) {
        uVar2 = *__args;
        uVar9 = this->back_;
        this->back_ = uVar9 + 1;
        puVar7 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->queue_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar7 >> 2) <= uVar9)
        goto LAB_0010b9e0;
        puVar7[uVar9] = uVar2;
        uVar9 = (ulong)*__args;
        puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar9)
        goto LAB_0010b9e0;
        puVar3[uVar9] = '?';
        this_00 = (DynamicPartialIndex *)this->updated_;
        iVar5._M_current = (uint *)this_00->graph_;
        if (iVar5._M_current == *(uint **)&this_00->k_) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,__args);
        }
        else {
          *iVar5._M_current = *__args;
          this_00->graph_ = (Graph *)(iVar5._M_current + 1);
        }
      }
    }
  }
LAB_0010b9e0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::collect_changes(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
        queue_.at(back_++) = s;
        dist.at(s) = INF8;
        updated_.push_back(s);
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}